

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool IsUnixSocketPath(string *name)

{
  long lVar1;
  size_type sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  string str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (name,&ADDR_PREFIX_UNIX_abi_cxx11_,0);
  if (sVar2 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&str,name,ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length,0xffffffffffffffff);
    bVar3 = str._M_string_length + 1 < 0x6d;
    std::__cxx11::string::~string((string *)&str);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsUnixSocketPath(const std::string& name)
{
#ifdef HAVE_SOCKADDR_UN
    if (name.find(ADDR_PREFIX_UNIX) != 0) return false;

    // Split off "unix:" prefix
    std::string str{name.substr(ADDR_PREFIX_UNIX.length())};

    // Path size limit is platform-dependent
    // see https://manpages.ubuntu.com/manpages/xenial/en/man7/unix.7.html
    if (str.size() + 1 > sizeof(((sockaddr_un*)nullptr)->sun_path)) return false;

    return true;
#else
    return false;
#endif
}